

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_incognito(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  char arg [4608];
  int level;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede4;
  int iVar3;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
               (char *)in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    if (*(short *)(in_RDI + 0x1e2) == 0) {
      iVar1 = get_trust(in_stack_ffffffffffffedd8);
      *(short *)(in_RDI + 0x1e2) = (short)iVar1;
      act(in_stack_ffffffffffffedf0,
          (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
          (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
          in_stack_ffffffffffffedd8,0);
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      *(undefined2 *)(in_RDI + 0x1e2) = 0;
      act(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8),
          (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
          in_stack_ffffffffffffedd8,0);
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
  }
  else {
    iVar1 = atoi(&stack0xffffffffffffede8);
    if ((iVar1 < 2) || (iVar3 = iVar1, iVar2 = get_trust(in_stack_ffffffffffffedd8), iVar2 < iVar3))
    {
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      *(undefined8 *)(in_RDI + 0x28) = 0;
      *(short *)(in_RDI + 0x1e2) = (short)iVar1;
      act(in_stack_ffffffffffffedf0,
          (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
          (void *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,0);
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
  }
  return;
}

Assistant:

void do_incognito(CHAR_DATA *ch, char *argument)
{
	int level;
	char arg[MAX_STRING_LENGTH];

	/* RT code for taking a level argument */
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		/* take the default path */

		if (ch->incog_level)
		{
			ch->incog_level = 0;
			act("$n is no longer cloaked.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You are no longer cloaked.\n\r", ch);
		}
		else
		{
			ch->incog_level = get_trust(ch);
			act("$n cloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You cloak your presence.\n\r", ch);
		}
	}
	else
	{
		/* do the level thing */
		level = atoi(arg);

		if (level < 2 || level > get_trust(ch))
		{
			send_to_char("Incog level must be between 2 and your level.\n\r", ch);
			return;
		}
		else
		{
			ch->reply = nullptr;
			ch->incog_level = level;
			act("$n cloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You cloak your presence.\n\r", ch);
		}
	}
}